

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O0

pair<bool,_ccs::Value> * __thiscall
anon_unknown.dwarf_38f65::P::parseAndReturnValue
          (pair<bool,_ccs::Value> *__return_storage_ptr__,P *this,string *input)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  pointer pAVar3;
  long local_3a0;
  bool local_359;
  Value local_358;
  bool local_2e9;
  long local_2e8;
  PropDef *propDef;
  bool local_275 [5];
  Value local_270;
  bool local_205 [20];
  allocator local_1f1;
  string local_1f0;
  undefined1 local_1d0 [8];
  Nested ast;
  istringstream str;
  string *input_local;
  P *this_local;
  
  std::__cxx11::istringstream::istringstream
            ((istringstream *)
             &ast.rules_.
              super__Vector_base<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)input,_S_in);
  ::ccs::ast::Nested::Nested((Nested *)local_1d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f0,"<literal>",&local_1f1);
  bVar1 = ::ccs::Parser::parseCcsStream
                    (&this->parser,&local_1f0,
                     (istream *)
                     &ast.rules_.
                      super__Vector_base<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(Nested *)local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    sVar2 = std::
            vector<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
            ::size((vector<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
                    *)&ast.selector_.
                       super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
    if (sVar2 == 1) {
      this_00 = std::
                vector<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
                ::operator[]((vector<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
                              *)&ast.selector_.
                                 super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount,0);
      pAVar3 = std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>::get
                         (this_00);
      if (pAVar3 == (pointer)0x0) {
        local_3a0 = 0;
      }
      else {
        local_3a0 = __dynamic_cast(pAVar3,&::ccs::ast::AstRule::typeinfo,
                                   &::ccs::ast::PropDef::typeinfo,0);
      }
      local_2e8 = local_3a0;
      if (local_3a0 == 0) {
        local_2e9 = false;
        ::ccs::Value::Value(&local_358);
        std::pair<bool,_ccs::Value>::pair<bool,_ccs::Value,_true>
                  (__return_storage_ptr__,&local_2e9,&local_358);
        ::ccs::Value::~Value(&local_358);
      }
      else {
        local_359 = true;
        std::pair<bool,_ccs::Value>::pair<bool,_ccs::Value_&,_true>
                  (__return_storage_ptr__,&local_359,(Value *)(local_3a0 + 0x28));
      }
    }
    else {
      local_275[0] = false;
      ::ccs::Value::Value((Value *)&propDef);
      std::pair<bool,_ccs::Value>::pair<bool,_ccs::Value,_true>
                (__return_storage_ptr__,local_275,(Value *)&propDef);
      ::ccs::Value::~Value((Value *)&propDef);
    }
  }
  else {
    local_205[0] = false;
    ::ccs::Value::Value(&local_270);
    std::pair<bool,_ccs::Value>::pair<bool,_ccs::Value,_true>
              (__return_storage_ptr__,local_205,&local_270);
    ::ccs::Value::~Value(&local_270);
  }
  local_275[1] = true;
  local_275[2] = false;
  local_275[3] = false;
  local_275[4] = false;
  ::ccs::ast::Nested::~Nested((Nested *)local_1d0);
  std::__cxx11::istringstream::~istringstream
            ((istringstream *)
             &ast.rules_.
              super__Vector_base<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, Value> parseAndReturnValue(const std::string &input) {
    std::istringstream str(input);
    ast::Nested ast;
    if (!parser.parseCcsStream("<literal>", str, ast)) return {false, Value()};
    if (ast.rules_.size() != 1) return {false, Value()};
    ast::PropDef *propDef = dynamic_cast<ast::PropDef*>(ast.rules_[0].get());
    if (!propDef) return {false, Value()};
    return {true, propDef->value_};
  }